

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_solid.cc
# Opt level: O0

void __thiscall hwtest::pgraph::MthdCharXyc::emulate_mthd(MthdCharXyc *this)

{
  int cstat;
  int cstat_00;
  int ycstat;
  int xcstat;
  MthdCharXyc *this_local;
  
  pgraph_clear_vtxid(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp);
  pgraph_bump_vtxid(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp);
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.xy_misc_1[0] =
       (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.xy_misc_1[0] & 0xfffffffe;
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.xy_misc_1[1] =
       (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.xy_misc_1[1] & 0xfffffffe | 1
  ;
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.xy_misc_3 =
       (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.xy_misc_3 & 0xfffffeff;
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid[0] =
       (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid[0] & 0xffffffef | 0x10;
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid[0] =
       (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid[0] & 0xffffefff |
       0x1000;
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid[0] =
       (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid[0] & 0xfff7ffff;
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.vtx_xy[4][0] =
       (uint32_t)((long)((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x2c) >> 0x34);
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.vtx_xy[4][1] =
       (int)(this->super_SingleMthdTest).super_MthdTest.val >> 0x14;
  cstat = nv04_pgraph_clip_status
                    (&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,
                     (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.vtx_xy[4][0],0)
  ;
  cstat_00 = nv04_pgraph_clip_status
                       (&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,
                        (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.vtx_xy[4][1]
                        ,1);
  pgraph_set_xy_d(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,0,0,0,false,false
                  ,false,cstat);
  pgraph_set_xy_d(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,1,0,0,false,false
                  ,false,cstat_00);
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.dma_misc =
       (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.dma_misc & 0xffff0000 |
       (this->super_SingleMthdTest).super_MthdTest.val & 0xff;
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.skip = true;
  return;
}

Assistant:

void emulate_mthd() override {
		pgraph_clear_vtxid(&exp);
		pgraph_bump_vtxid(&exp);
		insrt(exp.xy_misc_1[0], 0, 1, 0);
		insrt(exp.xy_misc_1[1], 0, 1, 1);
		insrt(exp.xy_misc_3, 8, 1, 0);
		insrt(exp.valid[0], 4, 1, 1);
		insrt(exp.valid[0], 0xc, 1, 1);
		insrt(exp.valid[0], 19, 1, 0);
		exp.vtx_xy[4][0] = extrs(val, 8, 12);
		exp.vtx_xy[4][1] = extrs(val, 20, 12);
		int xcstat = nv04_pgraph_clip_status(&exp, exp.vtx_xy[4][0], 0);
		int ycstat = nv04_pgraph_clip_status(&exp, exp.vtx_xy[4][1], 1);
		pgraph_set_xy_d(&exp, 0, 0, 0, false, false, false, xcstat);
		pgraph_set_xy_d(&exp, 1, 0, 0, false, false, false, ycstat);
		insrt(exp.dma_misc, 0, 16, extr(val, 0, 8));
		// XXX: do it right
		skip = true;
	}